

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<double>::resolve<double>
          (PromiseResolver<double> *this,double *value)

{
  QPromise<double> *pQVar1;
  Data *pDVar2;
  PromiseData<double> *pPVar3;
  QPromise<double> *promise;
  double *value_local;
  PromiseResolver<double> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>::operator->
                     (&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<double> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<double>_>::operator->
                       (&(pQVar1->super_QPromiseBase<double>).m_d);
    PromiseData<double>::resolve<double>(pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<double>_>::operator->
                       (&(pQVar1->super_QPromiseBase<double>).m_d);
    PromiseDataBase<double,_void_(const_double_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<double,_void_(const_double_&)>);
    release(this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }